

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_> *
__thiscall
toml::ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
          (success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
           *__return_storage_ptr__,toml *this,
          tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  value_type *pvVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  region local_90;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined2 local_10;
  
  uVar3 = *(undefined8 *)this;
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_90.source_name_._M_dataplus._M_p = (pointer)&local_90.source_name_.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x20);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(this + 0x10) == paVar1) {
    local_90.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90.source_name_.field_2._8_8_ = *(undefined8 *)(this + 0x28);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90.source_name_._M_dataplus._M_p;
  }
  else {
    local_90.source_name_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    paVar11 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)(this + 0x10);
  }
  sVar2 = *(size_type *)(this + 0x18);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 0x10) = paVar1;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x20] = (toml)0x0;
  local_90.last_column_ = *(size_t *)(this + 0x60);
  local_90.last_ = *(size_t *)(this + 0x50);
  local_90.last_line_ = *(size_t *)(this + 0x58);
  local_90.first_line_ = *(size_t *)(this + 0x40);
  local_90.first_column_ = *(size_t *)(this + 0x48);
  local_90.length_ = *(size_t *)(this + 0x30);
  local_90.first_ = *(size_t *)(this + 0x38);
  local_28 = *(undefined8 *)(this + 0x68);
  uStack_20 = *(undefined8 *)(this + 0x70);
  local_18 = *(undefined8 *)(this + 0x78);
  local_10 = *(undefined2 *)(this + 0x80);
  local_90.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->value).
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_ = uVar3;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(__return_storage_ptr__->value).
          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
          .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
          super__Tuple_impl<2UL,_toml::detail::region>.
          super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_ + 8))->_M_pi =
       p_Var4;
  local_90.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(__return_storage_ptr__->value).
                      super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                      .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                      super__Tuple_impl<2UL,_toml::detail::region>.
                      super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_ +
              0x10);
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.source_name_._M_dataplus._M_p = (pointer)paVar1;
  if (paVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.source_name_._M_dataplus._M_p) {
    paVar1->_M_allocated_capacity = local_90.source_name_.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->value).
             super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
             .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
             super__Tuple_impl<2UL,_toml::detail::region>.
             super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_ + 0x18) =
         local_90.source_name_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value).
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
    _M_head_impl.source_name_._M_dataplus._M_p = (pointer)paVar11;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__return_storage_ptr__->value).
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                super__Tuple_impl<2UL,_toml::detail::region>.
                super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_ + 0x10)
    )->_M_allocated_capacity = local_90.source_name_.field_2._M_allocated_capacity;
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
           .super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
           super__Tuple_impl<2UL,_toml::detail::region>.
           super__Head_base<2UL,_toml::detail::region,_false>._M_head_impl.source_name_ + 8) = sVar2
  ;
  local_90.source_name_._M_string_length = 0;
  local_90.source_name_.field_2._M_allocated_capacity =
       local_90.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.last_column_ = *(size_t *)(this + 0x60);
  sVar5 = *(size_t *)(this + 0x30);
  sVar6 = *(size_t *)(this + 0x38);
  sVar7 = *(size_t *)(this + 0x40);
  sVar8 = *(size_t *)(this + 0x48);
  sVar9 = *(size_t *)(this + 0x58);
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.last_ = *(size_t *)(this + 0x50);
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.last_line_ = sVar9;
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.first_line_ = sVar7;
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.first_column_ = sVar8;
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.length_ = sVar5;
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<2UL,_toml::detail::region>.super__Head_base<2UL,_toml::detail::region,_false>.
  _M_head_impl.first_ = sVar6;
  sVar5 = *(size_t *)(this + 0x70);
  *(undefined8 *)
   &(__return_storage_ptr__->value).
    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
    super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
    super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl =
       *(undefined8 *)(this + 0x68);
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
  super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.subsecond_precision =
       sVar5;
  uVar3 = *(undefined8 *)(this + 0x78);
  pvVar10 = &__return_storage_ptr__->value;
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour = (char)uVar3;
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute = (char)((ulong)uVar3 >> 8);
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second = (char)((ulong)uVar3 >> 0x10);
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3 =
       (char)((ulong)uVar3 >> 0x18);
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond =
       (short)((ulong)uVar3 >> 0x20);
  (pvVar10->
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>).
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond =
       (short)((ulong)uVar3 >> 0x30);
  (__return_storage_ptr__->value).
  super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>.
  super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond =
       *(uint16_t *)(this + 0x80);
  detail::region::~region(&local_90);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}